

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int InputTextCalcTextLenAndLineCount(char *text_begin,char **out_text_end)

{
  char cVar1;
  char *pcVar2;
  char *pcStack_28;
  char c;
  char *s;
  int line_count;
  char **out_text_end_local;
  char *text_begin_local;
  
  s._4_4_ = 0;
  pcStack_28 = text_begin;
  while( true ) {
    pcVar2 = pcStack_28 + 1;
    cVar1 = *pcStack_28;
    if (cVar1 == '\0') break;
    pcStack_28 = pcVar2;
    if (cVar1 == '\n') {
      s._4_4_ = s._4_4_ + 1;
    }
  }
  if ((*pcStack_28 != '\n') && (*pcStack_28 != '\r')) {
    s._4_4_ = s._4_4_ + 1;
  }
  *out_text_end = pcStack_28;
  return s._4_4_;
}

Assistant:

static int InputTextCalcTextLenAndLineCount(const char* text_begin, const char** out_text_end)
{
    int line_count = 0;
    const char* s = text_begin;
    while (char c = *s++) // We are only matching for \n so we can ignore UTF-8 decoding
        if (c == '\n')
            line_count++;
    s--;
    if (s[0] != '\n' && s[0] != '\r')
        line_count++;
    *out_text_end = s;
    return line_count;
}